

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

void mtbdd_refs_init_key(void)

{
  int iVar1;
  undefined8 *puVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  
  iVar1 = lace_is_worker();
  if (iVar1 != 0) {
    puVar2 = (undefined8 *)malloc(0x48);
    pvVar3 = malloc(0x2000);
    *puVar2 = pvVar3;
    puVar2[2] = pvVar3;
    puVar2[1] = (long)pvVar3 + 0x2000;
    pvVar3 = malloc(0x2000);
    puVar2[3] = pvVar3;
    puVar2[5] = pvVar3;
    puVar2[4] = (long)pvVar3 + 0x2000;
    pvVar3 = malloc(0x4000);
    puVar2[6] = pvVar3;
    puVar2[8] = pvVar3;
    puVar2[7] = (long)pvVar3 + 0x4000;
    *(undefined8 **)(in_FS_OFFSET + -0x18) = puVar2;
    return;
  }
  __assert_fail("lace_is_worker()",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                ,0x10c,"void mtbdd_refs_init_key(void)");
}

Assistant:

void
mtbdd_refs_init_key(void)
{
    assert(lace_is_worker()); // only use inside Lace workers
    mtbdd_refs_internal_t s = (mtbdd_refs_internal_t)malloc(sizeof(struct mtbdd_refs_internal));
    s->pcur = s->pbegin = (const MTBDD**)malloc(sizeof(MTBDD*) * 1024);
    s->pend = s->pbegin + 1024;
    s->rcur = s->rbegin = (MTBDD*)malloc(sizeof(MTBDD) * 1024);
    s->rend = s->rbegin + 1024;
    s->scur = s->sbegin = (mtbdd_refs_task_t)malloc(sizeof(struct mtbdd_refs_task) * 1024);
    s->send = s->sbegin + 1024;
    SET_THREAD_LOCAL(mtbdd_refs_key, s);
}